

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_36::HttpClientAdapter::connect
          (HttpClientAdapter *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Refcounted *pRVar1;
  uint *puVar2;
  AsyncIoStream *pAVar3;
  long *plVar4;
  PromiseArena *pPVar5;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  ReducePromises<kj::HttpClient::ConnectRequest::Status> RVar6;
  PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *pPVar7;
  ConnectResponseImpl *pCVar8;
  AsyncIoStreamWithGuards *this_00;
  void *pvVar9;
  undefined4 in_register_0000000c;
  size_t sVar10;
  void *__child_stack;
  undefined4 in_register_00000034;
  __fn *in_R8;
  __fn *__arg;
  HttpHeaders *params_3;
  undefined1 *in_R9;
  TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6780:26)>
  *location_02;
  PromiseBase local_220;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  Own<kj::AsyncIoStream,_std::nullptr_t> connectStream;
  PromiseFulfiller<void> *pPStack_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  Promise<void> promise;
  Own<kj::PromiseFulfiller<kj::HttpClient::ConnectRequest::Status>,_std::nullptr_t> local_1d0;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_1c0;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_1b0;
  OwnPromiseNode local_1a0;
  String hostCopy;
  PromiseFulfillerPair<kj::HttpClient::ConnectRequest::Status> paf;
  void *continuationTracePtr;
  char *pcStack_158;
  char *local_150;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t> response;
  Fault f;
  Own<kj::AsyncIoStreamWithGuards,_std::nullptr_t> guarded;
  TwoWayPipe pipe;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_7f;
  undefined1 local_50 [8];
  undefined8 local_48;
  StringPtr host_local;
  
  sVar10 = CONCAT44(in_register_0000000c,__len);
  __arg = in_R8;
  host_local.content.ptr = (char *)__addr;
  host_local.content.size_ = sVar10;
  str<kj::StringPtr&>(&hostCopy,(kj *)&host_local,(StringPtr *)__addr);
  HttpHeaders::clone((HttpHeaders *)&f,in_R8,__child_stack,(int)sVar10,__arg);
  heap<kj::HttpHeaders>((kj *)&headersCopy,(HttpHeaders *)&f);
  HttpHeaders::~HttpHeaders((HttpHeaders *)&f);
  newTwoWayPipe();
  location_00.function = (char *)local_1e8;
  location_00.fileName = (char *)uStack_1f0;
  location_00._16_8_ = promise.super_PromiseBase.node.ptr;
  newPromiseAndFulfiller<kj::HttpClient::ConnectRequest::Status>(location_00);
  pCVar8 = (ConnectResponseImpl *)operator_new(0x50);
  pAVar3 = pipe.ends[0].ptr;
  pPVar7 = paf.fulfiller.ptr;
  local_1d0.disposer = paf.fulfiller.disposer;
  paf.fulfiller.ptr = (PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *)0x0;
  pipe.ends[0].ptr = (AsyncIoStream *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)pipe.ends[0].disposer;
  (pCVar8->super_Refcounted).refcount = 0;
  pRVar1 = &pCVar8->super_Refcounted;
  (pCVar8->super_ConnectResponse)._vptr_ConnectResponse = (_func_int **)&PTR_accept_00593d40;
  (pCVar8->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00593d70
  ;
  local_1d0.ptr = (PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *)0x0;
  (pCVar8->fulfiller).disposer = paf.fulfiller.disposer;
  (pCVar8->fulfiller).ptr = pPVar7;
  local_1b0.disposer = pipe.ends[0].disposer;
  local_1b0.ptr = pAVar3;
  continuationTracePtr = anon_var_dwarf_67f91a;
  pcStack_158 = "initStreamsAndFulfiller";
  local_150 = (char *)0x1200001bf6;
  location_01.function = (char *)pRVar1;
  location_01.fileName = (char *)uStack_1f0;
  location_01._16_8_ = pipe.ends[0].disposer;
  newPromiseAndFulfiller<void>(location_01);
  __kjCondition = (char *)((ulong)__kjCondition & 0xffffffffffffff00);
  this_00 = (AsyncIoStreamWithGuards *)operator_new(0x88);
  local_1c0.disposer = pipe.ends[0].disposer;
  local_1c0.ptr = pAVar3;
  local_1b0.ptr = (AsyncIoStream *)0x0;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::Maybe
            ((Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)&f,
             (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)&_kjCondition)
  ;
  Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::Promise
            ((Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> *)
             &local_220,(Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)&f)
  ;
  local_1a0.ptr = (PromiseNode *)connectStream.disposer;
  connectStream.disposer = (Disposer *)0x0;
  AsyncIoStreamWithGuards::AsyncIoStreamWithGuards
            (this_00,&local_1c0,
             (Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> *)
             &local_220,(Promise<void> *)&local_1a0);
  guarded.disposer = (Disposer *)&kj::_::HeapDisposer<kj::AsyncIoStreamWithGuards>::instance;
  guarded.ptr = this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1a0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_220.node);
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::~Maybe
            ((Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)&f);
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&local_1c0);
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::~Maybe
            ((Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)&_kjCondition)
  ;
  (pCVar8->streamAndFulfiller).guarded.disposer =
       (Disposer *)&kj::_::HeapDisposer<kj::AsyncIoStreamWithGuards>::instance;
  (pCVar8->streamAndFulfiller).guarded.ptr = (AsyncIoStream *)this_00;
  guarded.ptr = (AsyncIoStreamWithGuards *)0x0;
  (pCVar8->streamAndFulfiller).fulfiller.disposer = (Disposer *)connectStream.ptr;
  (pCVar8->streamAndFulfiller).fulfiller.ptr = pPStack_1f8;
  Own<kj::AsyncIoStreamWithGuards,_std::nullptr_t>::dispose(&guarded);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)&connectStream);
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&local_1b0);
  pCVar8->connectStreamDetached = false;
  puVar2 = &(pCVar8->super_Refcounted).refcount;
  *puVar2 = *puVar2 + 1;
  response.disposer = &pRVar1->super_Disposer;
  response.ptr = pCVar8;
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose
            ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&promise);
  Own<kj::PromiseFulfiller<kj::HttpClient::ConnectRequest::Status>,_std::nullptr_t>::dispose
            (&local_1d0);
  __kjCondition = (char *)(CONCAT71(uStack_7f,pCVar8->connectStreamDetached) ^ 1);
  if (pCVar8->connectStreamDetached != false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1c14,FAILED,"!connectStreamDetached",
               "_kjCondition,\"the connect stream was already detached\"",&_kjCondition,
               (char (*) [40])"the connect stream was already detached");
    kj::_::Debug::Fault::fatal(&f);
  }
  pCVar8->connectStreamDetached = true;
  puVar2 = &(pCVar8->super_Refcounted).refcount;
  *puVar2 = *puVar2 + 1;
  pAVar3 = (pCVar8->streamAndFulfiller).guarded.ptr;
  f.exception = (Exception *)pRVar1;
  connectStream.disposer = (Disposer *)operator_new(0x28);
  connectStream.disposer[1]._vptr_Disposer = (_func_int **)pRVar1;
  connectStream.disposer[2]._vptr_Disposer = (_func_int **)pCVar8;
  connectStream.disposer[3]._vptr_Disposer =
       (_func_int **)(pCVar8->streamAndFulfiller).guarded.disposer;
  connectStream.disposer[4]._vptr_Disposer = (_func_int **)pAVar3;
  (pCVar8->streamAndFulfiller).guarded.ptr = (AsyncIoStream *)0x0;
  (connectStream.disposer)->_vptr_Disposer = (_func_int **)&PTR_disposeImpl_00593dd0;
  connectStream.ptr = (AsyncIoStream *)0x1;
  if (pAVar3 != (AsyncIoStream *)0x0) {
    connectStream.ptr = pAVar3;
  }
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t>
              *)&f);
  plVar4 = *(long **)(CONCAT44(in_register_00000034,__fd) + 8);
  if (hostCopy.content.size_ == 0) {
    hostCopy.content.ptr = "";
  }
  local_50[0] = *in_R9;
  local_48 = *(undefined8 *)(in_R9 + 8);
  params_3 = headersCopy.ptr;
  (**(code **)(*plVar4 + 8))
            (&local_220,plVar4,hostCopy.content.ptr,
             hostCopy.content.size_ + (hostCopy.content.size_ == 0),headersCopy.ptr,
             connectStream.ptr,pCVar8,local_50);
  response.ptr = (ConnectResponseImpl *)0x0;
  hostCopy.content.ptr = (char *)0x0;
  hostCopy.content.size_ = 0;
  headersCopy.ptr = (HttpHeaders *)0x0;
  connectStream.ptr = (AsyncIoStream *)0x0;
  __kjCondition =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  continuationTracePtr = kj::_::IdentityFunc<void>::operator();
  pPVar5 = *(PromiseArena **)((long)local_220.node.ptr + 8);
  if (pPVar5 == (PromiseArena *)0x0 || (ulong)((long)local_220.node.ptr - (long)pPVar5) < 0x70) {
    f.exception = (Exception *)pRVar1;
    pvVar9 = operator_new(0x400);
    location_02 = (TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6780:26)>
                   *)((long)pvVar9 + 0x390);
    ctor<kj::_::TransformPromiseNode<void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(kj::Exception&&)_1_,void*&>
              (location_02,&local_220.node,(IdentityFunc<void> *)&f,
               (anon_class_72_4_ff2e416c_for_errorHandler *)&continuationTracePtr,&params_3->table);
    *(void **)((long)pvVar9 + 0x398) = pvVar9;
  }
  else {
    *(PromiseArena **)((long)local_220.node.ptr + 8) = (PromiseArena *)0x0;
    location_02 = (TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6780:26)>
                   *)((long)local_220.node.ptr + -0x70);
    f.exception = (Exception *)pRVar1;
    ctor<kj::_::TransformPromiseNode<void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(kj::Exception&&)_1_,void*&>
              (location_02,&local_220.node,(IdentityFunc<void> *)&f,
               (anon_class_72_4_ff2e416c_for_errorHandler *)&continuationTracePtr,&params_3->table);
    *(PromiseArena **)((long)local_220.node.ptr + -0x68) = pPVar5;
  }
  local_1c0.disposer = (Disposer *)0x0;
  guarded.disposer = (Disposer *)0x0;
  local_1d0.disposer = (Disposer *)location_02;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&guarded);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1c0);
  location.function = "connect";
  location.fileName = __kjCondition;
  location.lineNumber = 0x1a7b;
  location.columnNumber = 0x14;
  kj::_::spark<kj::_::Void>((OwnPromiseNode *)&local_1b0,location);
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_1b0.disposer;
  local_1b0.disposer = (Disposer *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1b0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1d0);
  (anonymous_namespace)::HttpClientAdapter::
  connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::{lambda(kj::Exception&&)#1}
  ::~Exception((_lambda_kj__Exception____1_ *)&f);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_220.node);
  RVar6 = paf.promise;
  paf.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  (this->super_HttpClient)._vptr_HttpClient = (_func_int **)RVar6.super_PromiseBase.node.ptr;
  Own<kj::AsyncIoStream,decltype(nullptr)>::attach<kj::Promise<void>>
            ((Own<kj::AsyncIoStream,decltype(nullptr)> *)&this->service,
             (Promise<void> *)(pipe.ends + 1));
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&connectStream);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t>::~Own
            (&response);
  PromiseFulfillerPair<kj::HttpClient::ConnectRequest::Status>::~PromiseFulfillerPair(&paf);
  TwoWayPipe::~TwoWayPipe(&pipe);
  if (headersCopy.ptr != (HttpHeaders *)0x0) {
    headersCopy.ptr = (HttpHeaders *)0x0;
    (**(headersCopy.disposer)->_vptr_Disposer)();
  }
  Array<char>::~Array(&hostCopy.content);
  return (int)this;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers, HttpConnectSettings settings) override {
    // We have to clone the host and the headers because HttpServer implementation are allowed to
    // assusme that they remain valid until the service handler completes whereas HttpClient callers
    // are allowed to destroy them immediately after the call.
    auto hostCopy = kj::str(host);
    auto headersCopy = kj::heap(headers.clone());

    // 1. Create a new TwoWayPipe, one will be returned with the ConnectRequest,
    //    the other will be held by the ConnectResponseImpl.
    auto pipe = kj::newTwoWayPipe();

    // 2. Create a promise/fulfiller pair for the status. The promise will be
    //    returned with the ConnectResponse, the fulfiller will be held by the
    //    ConnectResponseImpl.
    auto paf = kj::newPromiseAndFulfiller<ConnectRequest::Status>();

    // 3. Create the ConnectResponseImpl
    auto response = kj::refcounted<ConnectResponseImpl>(kj::mv(paf.fulfiller),
                                                        kj::mv(pipe.ends[0]));

    // 5. Call service.connect, passing in the tunnel.
    //    The call to tunnel->getConnectStream() returns a guarded stream that will buffer
    //    writes until the status is indicated by calling accept/reject.
    auto connectStream = response->getConnectStream();
    auto promise = service.connect(hostCopy, *headersCopy, *connectStream, *response, settings)
        .eagerlyEvaluate([response=kj::mv(response),
                          host=kj::mv(hostCopy),
                          headers=kj::mv(headersCopy),
                          connectStream=kj::mv(connectStream)](kj::Exception&& ex) mutable {
      // A few things need to happen here.
      //   1. We'll log the exception.
      //   2. We'll break the pipe.
      //   3. We'll reject the status promise if it is still pending.
      //
      // We'll do all of this within the ConnectResponseImpl, however, since it
      // maintains the state necessary here.
      response->handleException(kj::mv(ex), kj::mv(connectStream));
    });

    // TODO(bug): There's a challenge with attaching the service.connect promise to the
    // connection stream below in that the client will likely drop the connection as soon
    // as it reads EOF, but the promise representing the service connect() call may still
    // be running and want to do some cleanup after it has sent EOF. That cleanup will be
    // canceled. For regular HTTP calls, DelayedEofInputStream was created to address this
    // exact issue but with connect() being bidirectional it's rather more difficult. We
    // want a delay similar to what DelayedEofInputStream adds but only when both directions
    // have been closed. That currently is not possible until we have an alternative to
    // shutdownWrite() that returns a Promise (e.g. Promise<void> end()). For now, we can
    // live with the current limitation.
    return ConnectRequest {
      kj::mv(paf.promise),
      pipe.ends[1].attach(kj::mv(promise)),
    };
  }